

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colAlloc.c
# Opt level: O0

void PoolCleanup(MemoryPool *pool)

{
  ulong uVar1;
  Page *local_28;
  Page *page;
  Page *next;
  Page *base;
  MemoryPool *pool_local;
  
  CleanupSweepables(pool);
  next = pool->pages;
  while (next != (Page *)0x0) {
    for (local_28 = next; (*(ulong *)*local_28 & 0x20) == 0;
        local_28 = (Page *)(*(ulong *)*local_28 & 0xffffffffffffff00)) {
    }
    uVar1 = *(ulong *)*local_28;
    SysPageFree(next);
    next = (Page *)(uVar1 & 0xffffffffffffff00);
  }
  return;
}

Assistant:

void
PoolCleanup(
    MemoryPool *pool)   /*!< Pool to cleanup. */
{
    Page *base, *next, *page;

    /*
     * Cleanup sweepable custom ropes (those with a freeProc).
     */

    CleanupSweepables(pool);

    /*
     * Free all system pages.
     */

    for (base = pool->pages; base; base = next) {
        for (page = base; !PAGE_FLAG(page, PAGE_FLAG_LAST);
                page = PAGE_NEXT(page));
        next = PAGE_NEXT(page);
        ASSERT(PAGE_FLAG(base, PAGE_FLAG_FIRST));
        SysPageFree(base);
    }
}